

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkDupObj(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj,int fCopyName)

{
  Hop_Man_t *pSour;
  Hop_Man_t *pDest;
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  DdNode *pDVar4;
  Hop_Obj_t *pHVar5;
  Abc_Obj_t *pObjNew;
  int fCopyName_local;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pObj_00 = Abc_NtkCreateObj(pNtkNew,*(Abc_ObjType_t *)&pObj->field_0x14 &
                                     (ABC_OBJ_LATCH|ABC_OBJ_NODE));
  if (fCopyName != 0) {
    iVar1 = Abc_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjIsBox(pObj);
        if ((iVar1 != 0) || (iVar1 = Abc_ObjIsNet(pObj), iVar1 != 0)) {
          pcVar3 = Abc_ObjName(pObj);
          Abc_ObjAssignName(pObj_00,pcVar3,(char *)0x0);
        }
      }
      else {
        iVar1 = Abc_NtkIsNetlist(pNtkNew);
        if (iVar1 == 0) {
          iVar1 = Abc_ObjIsPo(pObj);
          if (iVar1 == 0) {
            pAVar2 = Abc_ObjFanout0(pObj);
            iVar1 = Abc_ObjIsLatch(pAVar2);
            if (iVar1 == 0) {
              __assert_fail("Abc_ObjIsLatch(Abc_ObjFanout0(pObj))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                            ,0x16b,"Abc_Obj_t *Abc_NtkDupObj(Abc_Ntk_t *, Abc_Obj_t *, int)");
            }
            pcVar3 = Abc_ObjName(pObj);
            Abc_ObjAssignName(pObj_00,pcVar3,(char *)0x0);
          }
          else {
            pAVar2 = Abc_ObjFanin0Ntk(pObj);
            pcVar3 = Abc_ObjName(pAVar2);
            Abc_ObjAssignName(pObj_00,pcVar3,(char *)0x0);
          }
        }
      }
    }
    else {
      iVar1 = Abc_NtkIsNetlist(pNtkNew);
      if (iVar1 == 0) {
        pAVar2 = Abc_ObjFanout0Ntk(pObj);
        pcVar3 = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pObj_00,pcVar3,(char *)0x0);
      }
    }
  }
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsNet(pObj);
    if ((iVar1 == 0) && (iVar1 = Abc_ObjIsLatch(pObj), iVar1 != 0)) {
      pObj_00->field_5 = pObj->field_5;
    }
  }
  else if ((pNtkNew->ntkFunc == pObj->pNtk->ntkFunc) &&
          (iVar1 = Abc_NtkIsStrash(pNtkNew), iVar1 == 0)) {
    iVar1 = Abc_NtkHasSop(pNtkNew);
    if ((iVar1 == 0) && (iVar1 = Abc_NtkHasBlifMv(pNtkNew), iVar1 == 0)) {
      iVar1 = Abc_NtkHasBdd(pNtkNew);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkHasAig(pNtkNew);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkHasMapping(pNtkNew);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                          ,0x184,"Abc_Obj_t *Abc_NtkDupObj(Abc_Ntk_t *, Abc_Obj_t *, int)");
          }
          pObj_00->field_5 = pObj->field_5;
          pNtkNew->nBarBufs2 =
               (uint)(((pObj->field_5).pData != (void *)0x0 ^ 0xffU) & 1) + pNtkNew->nBarBufs2;
        }
        else {
          pSour = (Hop_Man_t *)pObj->pNtk->pManFunc;
          pDest = (Hop_Man_t *)pNtkNew->pManFunc;
          pHVar5 = (Hop_Obj_t *)(pObj->field_5).pData;
          iVar1 = Abc_ObjFaninNum(pObj);
          pHVar5 = Hop_Transfer(pSour,pDest,pHVar5,iVar1);
          (pObj_00->field_5).pData = pHVar5;
        }
      }
      else {
        pDVar4 = Cudd_bddTransfer((DdManager *)pObj->pNtk->pManFunc,(DdManager *)pNtkNew->pManFunc,
                                  (DdNode *)(pObj->field_5).pData);
        (pObj_00->field_5).pData = pDVar4;
        Cudd_Ref((DdNode *)(pObj_00->field_5).pData);
      }
    }
    else {
      pcVar3 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,(char *)(pObj->field_5).pData);
      (pObj_00->field_5).pData = pcVar3;
    }
  }
  (pObj->field_6).pCopy = pObj_00;
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkDupObj( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj, int fCopyName )
{
    Abc_Obj_t * pObjNew;
    // create the new object
    pObjNew = Abc_NtkCreateObj( pNtkNew, (Abc_ObjType_t)pObj->Type );
    // transfer names of the terminal objects
    if ( fCopyName )
    {
        if ( Abc_ObjIsCi(pObj) )
        {
            if ( !Abc_NtkIsNetlist(pNtkNew) )
                Abc_ObjAssignName( pObjNew, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
        }
        else if ( Abc_ObjIsCo(pObj) )
        {
            if ( !Abc_NtkIsNetlist(pNtkNew) )
            {
                if ( Abc_ObjIsPo(pObj) )
                    Abc_ObjAssignName( pObjNew, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
                else
                {
                    assert( Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) );
                    Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
                }
            }
        }
        else if ( Abc_ObjIsBox(pObj) || Abc_ObjIsNet(pObj) )
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
    }
    // copy functionality/names
    if ( Abc_ObjIsNode(pObj) ) // copy the function if functionality is compatible
    {
        if ( pNtkNew->ntkFunc == pObj->pNtk->ntkFunc ) 
        {
            if ( Abc_NtkIsStrash(pNtkNew) ) 
            {}
            else if ( Abc_NtkHasSop(pNtkNew) || Abc_NtkHasBlifMv(pNtkNew) )
                pObjNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, (char *)pObj->pData );
#ifdef ABC_USE_CUDD
            else if ( Abc_NtkHasBdd(pNtkNew) )
                pObjNew->pData = Cudd_bddTransfer((DdManager *)pObj->pNtk->pManFunc, (DdManager *)pNtkNew->pManFunc, (DdNode *)pObj->pData), Cudd_Ref((DdNode *)pObjNew->pData);
#endif
            else if ( Abc_NtkHasAig(pNtkNew) )
                pObjNew->pData = Hop_Transfer((Hop_Man_t *)pObj->pNtk->pManFunc, (Hop_Man_t *)pNtkNew->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj));
            else if ( Abc_NtkHasMapping(pNtkNew) )
                pObjNew->pData = pObj->pData, pNtkNew->nBarBufs2 += !pObj->pData;
            else assert( 0 );
        }
    }
    else if ( Abc_ObjIsNet(pObj) ) // copy the name
    {
    }
    else if ( Abc_ObjIsLatch(pObj) ) // copy the reset value
        pObjNew->pData = pObj->pData;
    // transfer HAIG
//    pObjNew->pEquiv = pObj->pEquiv;
    // remember the new node in the old node
    pObj->pCopy = pObjNew;
    return pObjNew;
}